

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O3

void __thiscall FDrawInfo::ClearBuffers(FDrawInfo *this)

{
  gl_subsectorrendernode *pgVar1;
  uint uVar2;
  gl_subsectorrendernode *pgVar3;
  ulong uVar4;
  
  uVar2 = (this->otherfloorplanes).Count;
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      pgVar3 = (this->otherfloorplanes).Array[uVar4];
      if (pgVar3 != (gl_subsectorrendernode *)0x0) {
        do {
          pgVar1 = pgVar3->next;
          operator_delete(pgVar3,0x10);
          pgVar3 = pgVar1;
        } while (pgVar1 != (gl_subsectorrendernode *)0x0);
        uVar2 = (this->otherfloorplanes).Count;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
    if (uVar2 != 0) {
      (this->otherfloorplanes).Count = 0;
    }
  }
  uVar2 = (this->otherceilingplanes).Count;
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      pgVar3 = (this->otherceilingplanes).Array[uVar4];
      if (pgVar3 != (gl_subsectorrendernode *)0x0) {
        do {
          pgVar1 = pgVar3->next;
          operator_delete(pgVar3,0x10);
          pgVar3 = pgVar1;
        } while (pgVar1 != (gl_subsectorrendernode *)0x0);
        uVar2 = (this->otherceilingplanes).Count;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
    if (uVar2 != 0) {
      (this->otherceilingplanes).Count = 0;
    }
  }
  if ((this->MissingUpperTextures).Count != 0) {
    (this->MissingUpperTextures).Count = 0;
  }
  if ((this->MissingLowerTextures).Count != 0) {
    (this->MissingLowerTextures).Count = 0;
  }
  if ((this->MissingUpperSegs).Count != 0) {
    (this->MissingUpperSegs).Count = 0;
  }
  if ((this->MissingLowerSegs).Count != 0) {
    (this->MissingLowerSegs).Count = 0;
  }
  if ((this->SubsectorHacks).Count != 0) {
    (this->SubsectorHacks).Count = 0;
  }
  if ((this->CeilingStacks).Count != 0) {
    (this->CeilingStacks).Count = 0;
  }
  if ((this->FloorStacks).Count != 0) {
    (this->FloorStacks).Count = 0;
  }
  if ((this->HandledSubsectors).Count != 0) {
    (this->HandledSubsectors).Count = 0;
  }
  return;
}

Assistant:

void FDrawInfo::ClearBuffers()
{
	for(unsigned int i=0;i< otherfloorplanes.Size();i++)
	{
		gl_subsectorrendernode * node = otherfloorplanes[i];
		while (node)
		{
			gl_subsectorrendernode * n = node;
			node = node->next;
			SSR_List.Release(n);
		}
	}
	otherfloorplanes.Clear();

	for(unsigned int i=0;i< otherceilingplanes.Size();i++)
	{
		gl_subsectorrendernode * node = otherceilingplanes[i];
		while (node)
		{
			gl_subsectorrendernode * n = node;
			node = node->next;
			SSR_List.Release(n);
		}
	}
	otherceilingplanes.Clear();

	// clear all the lists that might not have been cleared already
	MissingUpperTextures.Clear();
	MissingLowerTextures.Clear();
	MissingUpperSegs.Clear();
	MissingLowerSegs.Clear();
	SubsectorHacks.Clear();
	CeilingStacks.Clear();
	FloorStacks.Clear();
	HandledSubsectors.Clear();

}